

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O3

Ownership __thiscall TCMallocImplementation::GetOwnership(TCMallocImplementation *this,void *ptr)

{
  Ownership OVar1;
  ulong uVar2;
  
  OVar1 = kNotOwned;
  if ((ulong)ptr >> 0x30 == 0) {
    uVar2 = (ulong)ptr >> 0xd;
    OVar1 = kOwned;
    if ((0x7f < (uVar2 & 0xffffffffffff0000 ^
                *(ulong *)(tcmalloc::Static::pageheap_ + (uVar2 & 0xffff) * 8 + 0x10))) &&
       ((*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) == 0 ||
        (*(long *)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)ptr >> 0x1f) * 8 + 0x80010) +
                  (ulong)((uint)uVar2 & 0x3ffff) * 8) == 0)))) {
      return kNotOwned;
    }
  }
  return OVar1;
}

Assistant:

virtual Ownership GetOwnership(const void* ptr) {
    const PageID p = reinterpret_cast<uintptr_t>(ptr) >> kPageShift;
    // The rest of tcmalloc assumes that all allocated pointers use at
    // most kAddressBits bits.  If ptr doesn't, then it definitely
    // wasn't alloacted by tcmalloc.
    if ((p >> (kAddressBits - kPageShift)) > 0) {
      return kNotOwned;
    }
    uint32_t cl;
    if (Static::pageheap()->TryGetSizeClass(p, &cl)) {
      return kOwned;
    }
    const Span *span = Static::pageheap()->GetDescriptor(p);
    if (span) {
      return kOwned;
    }
    return tcmalloc::IsEmergencyPtr(ptr) ? kOwned : kNotOwned;
  }